

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlNsPtr xmlCopyNamespaceList(xmlNsPtr cur)

{
  xmlNsPtr pxVar1;
  xmlNsPtr pxVar2;
  xmlNsPtr pxVar3;
  xmlNsPtr pxVar4;
  
  if (cur != (xmlNsPtr)0x0) {
    pxVar3 = (xmlNsPtr)0x0;
    pxVar4 = (xmlNsPtr)0x0;
    do {
      if (cur->type == XML_NAMESPACE_DECL) {
        pxVar1 = xmlNewNs((xmlNodePtr)0x0,cur->href,cur->prefix);
      }
      else {
        pxVar1 = (xmlNsPtr)0x0;
      }
      pxVar2 = pxVar1;
      if (pxVar3 != (xmlNsPtr)0x0) {
        pxVar3->next = pxVar1;
        pxVar2 = pxVar4;
      }
      cur = cur->next;
      pxVar3 = pxVar1;
      pxVar4 = pxVar2;
    } while (cur != (_xmlNs *)0x0);
    return pxVar2;
  }
  return (xmlNsPtr)0x0;
}

Assistant:

xmlNsPtr
xmlCopyNamespaceList(xmlNsPtr cur) {
    xmlNsPtr ret = NULL;
    xmlNsPtr p = NULL,q;

    while (cur != NULL) {
        q = xmlCopyNamespace(cur);
	if (p == NULL) {
	    ret = p = q;
	} else {
	    p->next = q;
	    p = q;
	}
	cur = cur->next;
    }
    return(ret);
}